

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

double P_GetFriction(AActor *mo,double *frictionfactor)

{
  F3DFloor *pFVar1;
  sector_t *psVar2;
  double *this;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Self *other;
  F3DFloor **ppFVar8;
  FTerrainDef *pFVar9;
  secplane_t *psVar10;
  sector_t_conflict *psVar11;
  double dVar12;
  double dVar13;
  TVector2<double> local_e0;
  TVector2<double> local_d0;
  TVector2<double> local_c0;
  TVector2<double> local_b0;
  TVector2<double> local_a0;
  F3DFloor *local_90;
  F3DFloor *rover_1;
  undefined1 local_80 [4];
  uint i_1;
  DVector3 pos;
  F3DFloor *rover;
  uint i;
  TFlags<ActorFlag2,_unsigned_int> local_4c;
  sector_t *local_48;
  sector_t_conflict *sec;
  msecnode_t *m;
  double newmf;
  double newfriction;
  double movefactor;
  double friction;
  double *frictionfactor_local;
  AActor *mo_local;
  
  movefactor = 0.90625;
  newfriction = 0.03125;
  friction = (double)frictionfactor;
  frictionfactor_local = (double *)mo;
  bVar3 = AActor::IsNoClip2(mo);
  if (!bVar3) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_4c,(int)frictionfactor_local + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    bVar3 = false;
    if (uVar5 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&i,
                 (int)frictionfactor_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)&i);
      bVar3 = uVar5 != 0;
    }
    if (bVar3) {
      movefactor = 0.91796875;
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&rover + 4),
                 (int)frictionfactor_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&rover + 4));
      if (((uVar5 != 0) || (bVar3 = true, *(int *)(frictionfactor_local + 0x5a) < 2)) &&
         (bVar3 = false, *(int *)(frictionfactor_local + 0x5a) == 1)) {
        dVar12 = AActor::Z((AActor *)frictionfactor_local);
        bVar3 = frictionfactor_local[0x28] + 6.0 < dVar12;
      }
      if (bVar3) {
        movefactor = sector_t::GetFriction((sector_t *)frictionfactor_local[0x26],0,&newfriction);
        newfriction = newfriction * 0.5;
        for (rover._0_4_ = 0; uVar5 = (uint)rover,
            uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)((long)frictionfactor_local[0x26] + 0x210) + 0x70)),
            uVar5 < uVar6; rover._0_4_ = (uint)rover + 1) {
          ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               (*(long *)((long)frictionfactor_local[0x26] + 0x210) + 0x70),
                               (ulong)(uint)rover);
          pFVar1 = *ppFVar8;
          if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 0x10) != 0)) {
            dVar12 = AActor::Z((AActor *)frictionfactor_local);
            dVar13 = secplane_t::ZatPoint((pFVar1->top).plane,(AActor *)frictionfactor_local);
            if (dVar12 <= dVar13) {
              dVar12 = AActor::Z((AActor *)frictionfactor_local);
              dVar13 = secplane_t::ZatPoint((pFVar1->bottom).plane,(AActor *)frictionfactor_local);
              if ((dVar13 <= dVar12) &&
                 ((newmf = sector_t::GetFriction(pFVar1->model,(pFVar1->top).isceiling,(double *)&m)
                  , newmf < movefactor || ((movefactor == 0.90625 && (!NAN(movefactor))))))) {
                newfriction = (double)m * 0.5;
                movefactor = newmf;
              }
            }
          }
        }
      }
      else {
        bVar4 = FBoolCVar::operator_cast_to_bool(&var_friction);
        bVar3 = false;
        if (bVar4) {
          other = (Self *)((long)frictionfactor_local + 0x1bc);
          operator|((int)&pos + MF_NOBLOCKMAP,MF_NOCLIP);
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)((long)&pos.Z + 4),other);
          uVar5 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Z + 4));
          bVar3 = uVar5 == 0;
        }
        if (bVar3) {
          for (sec = (sector_t_conflict *)frictionfactor_local[0x71];
              sec != (sector_t_conflict *)0x0;
              sec = (sector_t_conflict *)sec->planes[0].xform.xScale) {
            local_48 = (sector_t *)sec->planes[0].xform.xOffs;
            AActor::PosRelative((DVector3 *)local_80,(AActor *)frictionfactor_local,local_48);
            for (rover_1._4_4_ = 0; uVar5 = rover_1._4_4_,
                uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&local_48->e->XFloor),
                uVar5 < uVar6; rover_1._4_4_ = rover_1._4_4_ + 1) {
              ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&local_48->e->XFloor,
                                   (ulong)rover_1._4_4_);
              this = frictionfactor_local;
              local_90 = *ppFVar8;
              if ((local_90->flags & 1) != 0) {
                if ((local_90->flags & 2) == 0) {
                  if ((local_90->flags & 0x10) != 0) {
                    dVar12 = AActor::Z((AActor *)frictionfactor_local);
                    psVar10 = (local_90->top).plane;
                    TVector2<double>::TVector2(&local_b0,(TVector3<double> *)local_80);
                    dVar13 = secplane_t::ZatPoint(psVar10,&local_b0);
                    bVar3 = true;
                    if (dVar12 <= dVar13) {
                      dVar12 = AActor::Top((AActor *)frictionfactor_local);
                      psVar10 = (local_90->bottom).plane;
                      TVector2<double>::TVector2(&local_c0,(TVector3<double> *)local_80);
                      dVar13 = secplane_t::ZatPoint(psVar10,&local_c0);
                      bVar3 = dVar12 < dVar13;
                    }
                    if (!bVar3) goto LAB_0057c6b4;
                  }
                }
                else {
                  psVar10 = (local_90->top).plane;
                  TVector2<double>::TVector2(&local_a0,(TVector3<double> *)local_80);
                  dVar12 = secplane_t::ZatPoint(psVar10,&local_a0);
                  bVar3 = AActor::isAtZ((AActor *)this,dVar12);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_0057c6b4:
                    newmf = sector_t::GetFriction
                                      (local_90->model,(local_90->top).isceiling,(double *)&m);
                    if ((newmf < movefactor) || ((movefactor == 0.90625 && (!NAN(movefactor))))) {
                      newfriction = (double)m;
                      movefactor = newmf;
                    }
                  }
                }
              }
            }
            if ((local_48->Flags & 0x10) == 0) {
              iVar7 = sector_t::GetTerrain(local_48,0);
              pFVar9 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar7);
              if ((pFVar9->Friction != 0.0) || (NAN(pFVar9->Friction))) goto LAB_0057c761;
            }
            else {
LAB_0057c761:
              newmf = sector_t::GetFriction(local_48,0,(double *)&m);
              if (newmf < movefactor) {
LAB_0057c7aa:
                dVar12 = AActor::Z((AActor *)frictionfactor_local);
                psVar10 = &local_48->floorplane;
                TVector2<double>::TVector2(&local_d0,(TVector3<double> *)local_80);
                dVar13 = secplane_t::ZatPoint(psVar10,&local_d0);
                bVar3 = true;
                if (dVar13 < dVar12) {
                  psVar11 = sector_t::GetHeightSec(local_48);
                  bVar3 = false;
                  if (psVar11 != (sector_t_conflict *)0x0) {
                    dVar12 = AActor::Z((AActor *)frictionfactor_local);
                    psVar2 = local_48->heightsec;
                    TVector2<double>::TVector2(&local_e0,(TVector3<double> *)local_80);
                    dVar13 = secplane_t::ZatPoint(&psVar2->floorplane,&local_e0);
                    bVar3 = dVar12 <= dVar13;
                  }
                }
              }
              else {
                bVar3 = false;
                if ((movefactor == 0.90625) && (!NAN(movefactor))) goto LAB_0057c7aa;
              }
              if (bVar3) {
                movefactor = newmf;
                newfriction = (double)m;
              }
            }
          }
        }
      }
    }
  }
  if ((frictionfactor_local[99] != 1.0) || (NAN(frictionfactor_local[99]))) {
    movefactor = clamp<double>(movefactor * frictionfactor_local[99],0.0,1.0);
    newfriction = FrictionToMoveFactor(movefactor);
  }
  if (friction != 0.0) {
    *(double *)friction = newfriction;
  }
  return movefactor;
}

Assistant:

double P_GetFriction(const AActor *mo, double *frictionfactor)
{
	double friction = ORIG_FRICTION;
	double movefactor = ORIG_FRICTION_FACTOR;
	double newfriction;
	double newmf;

	const msecnode_t *m;
	sector_t *sec;

	if (mo->IsNoClip2())
	{
		// The default values are fine for noclip2 mode
	}
	else if (mo->flags2 & MF2_FLY && mo->flags & MF_NOGRAVITY)
	{
		friction = FRICTION_FLY;
	}
	else if ((!(mo->flags & MF_NOGRAVITY) && mo->waterlevel > 1) ||
		(mo->waterlevel == 1 && mo->Z() > mo->floorz+ 6))
	{
		friction = mo->Sector->GetFriction(sector_t::floor, &movefactor);
		movefactor *= 0.5;

		// Check 3D floors -- might be the source of the waterlevel
		for (unsigned i = 0; i < mo->Sector->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor *rover = mo->Sector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() > rover->top.plane->ZatPoint(mo) ||
				mo->Z() < rover->bottom.plane->ZatPoint(mo))
				continue;

			newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
			if (newfriction < friction || friction == ORIG_FRICTION)
			{
				friction = newfriction;
				movefactor = newmf * 0.5;
			}
		}
	}
	else if (var_friction && !(mo->flags & (MF_NOCLIP | MF_NOGRAVITY)))
	{	// When the object is straddling sectors with the same
		// floor height that have different frictions, use the lowest
		// friction value (muddy has precedence over icy).

		for (m = mo->touching_sectorlist; m; m = m->m_tnext)
		{
			sec = m->m_sector;
			DVector3 pos = mo->PosRelative(sec);

			// 3D floors must be checked, too
			for (unsigned i = 0; i < sec->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;

				if (rover->flags & FF_SOLID)
				{
					// Must be standing on a solid floor
					if (!mo->isAtZ(rover->top.plane->ZatPoint(pos))) continue;
				}
				else if (rover->flags & FF_SWIMMABLE)
				{
					// Or on or inside a swimmable floor (e.g. in shallow water)
					if (mo->Z() > rover->top.plane->ZatPoint(pos) ||
						(mo->Top()) < rover->bottom.plane->ZatPoint(pos))
						continue;
				}
				else
					continue;

				newfriction = rover->model->GetFriction(rover->top.isceiling, &newmf);
				if (newfriction < friction || friction == ORIG_FRICTION)
				{
					friction = newfriction;
					movefactor = newmf;
				}
			}

			if (!(sec->Flags & SECF_FRICTION) &&
				Terrains[sec->GetTerrain(sector_t::floor)].Friction == 0)
			{
				continue;
			}
			newfriction = sec->GetFriction(sector_t::floor, &newmf);
			if ((newfriction < friction || friction == ORIG_FRICTION) &&
				(mo->Z() <= sec->floorplane.ZatPoint(pos) ||
				(sec->GetHeightSec() != NULL &&
				mo->Z() <= sec->heightsec->floorplane.ZatPoint(pos))))
			{
				friction = newfriction;
				movefactor = newmf;
			}
		}
	}

	if (mo->Friction != 1)
	{
		friction = clamp((friction * mo->Friction), 0., 1.);
		movefactor = FrictionToMoveFactor(friction);
	}

	if (frictionfactor)
		*frictionfactor = movefactor;

	return friction;
}